

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pruned_spherical_quadrature.hpp
# Opt level: O1

void __thiscall
IntegratorXX::RadialGridPartition<IntegratorXX::LebedevLaikov<double>>::
add_quad<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>>
          (RadialGridPartition<IntegratorXX::LebedevLaikov<double>> *this,
          RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>
          *rq,size_t idx,Quadrature<IntegratorXX::LebedevLaikov<double>_> *q)

{
  iterator __position;
  bool bVar1;
  size_t local_18;
  
  __position._M_current = *(unsigned_long **)(this + 8);
  local_18 = idx;
  if (__position._M_current == *(unsigned_long **)this) {
    bVar1 = idx == 0;
  }
  else {
    if (idx <= __position._M_current[-1]) goto LAB_00148b2b;
    bVar1 = idx < ((long)(rq->
                         super_Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>_>
                         ).
                         super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                         .points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(rq->
                         super_Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>_>
                         ).
                         super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                         .points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) - 1U;
  }
  if (bVar1) {
    if (__position._M_current == *(unsigned_long **)(this + 0x10)) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_realloc_insert<unsigned_long&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)this,__position,&local_18);
    }
    else {
      *__position._M_current = idx;
      *(unsigned_long **)(this + 8) = __position._M_current + 1;
    }
    std::
    vector<IntegratorXX::Quadrature<IntegratorXX::LebedevLaikov<double>>,std::allocator<IntegratorXX::Quadrature<IntegratorXX::LebedevLaikov<double>>>>
    ::emplace_back<IntegratorXX::Quadrature<IntegratorXX::LebedevLaikov<double>>const&>
              ((vector<IntegratorXX::Quadrature<IntegratorXX::LebedevLaikov<double>>,std::allocator<IntegratorXX::Quadrature<IntegratorXX::LebedevLaikov<double>>>>
                *)(this + 0x18),q);
    return;
  }
LAB_00148b2b:
  __assert_fail("partition_idx_.size() ? (idx > partition_idx_.back() && idx < (rq.npts()-1)) : (idx == 0)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/wavefunction91[P]IntegratorXX/include/integratorxx/composite_quadratures/pruned_spherical_quadrature.hpp"
                ,0x26,
                "void IntegratorXX::RadialGridPartition<IntegratorXX::LebedevLaikov<double>>::add_quad(const RadialQuad &, size_t, const Quadrature<AngularQuad> &) [AngularQuad = IntegratorXX::LebedevLaikov<double>, RadialQuad = IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double, double>, IntegratorXX::MuraKnowlesRadialTraits>]"
               );
}

Assistant:

void add_quad( const RadialQuad& rq, size_t idx, 
		  const Quadrature<AngularQuad>& q ) { 
    assert(partition_idx_.size() ?
      (idx > partition_idx_.back() && idx < (rq.npts()-1)) : (idx == 0));
    (void)(rq);

    partition_idx_.emplace_back(idx);
    quads_.emplace_back(q);
  }